

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

void __thiscall helics::SmallBuffer::reserve(SmallBuffer *this,size_t size)

{
  undefined8 uVar1;
  void *__dest;
  ulong in_RSI;
  long in_RDI;
  byte *ndata;
  bad_alloc *in_stack_ffffffffffffffd0;
  
  if (*(ulong *)(in_RDI + 0x48) < in_RSI) {
    if ((0x1000000000 < in_RSI) || ((*(byte *)(in_RDI + 0x59) & 1) != 0)) {
      uVar1 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffffd0);
      __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    __dest = operator_new__(in_RSI + 8);
    memcpy(__dest,*(void **)(in_RDI + 0x50),*(size_t *)(in_RDI + 0x40));
    if ((((*(byte *)(in_RDI + 0x5a) & 1) != 0) && ((*(byte *)(in_RDI + 0x58) & 1) == 0)) &&
       (*(void **)(in_RDI + 0x50) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0x50));
    }
    *(void **)(in_RDI + 0x50) = __dest;
    *(undefined1 *)(in_RDI + 0x58) = 0;
    *(undefined1 *)(in_RDI + 0x5a) = 1;
    *(ulong *)(in_RDI + 0x48) = in_RSI + 8;
  }
  return;
}

Assistant:

void reserve(size_t size)
    {
        static constexpr size_t bigSize{sizeof(size_t) == 8 ? 0x010'0000'0000U : 0xFFFF'0000U};
        if (size > bufferCapacity) {
            if (size > bigSize || locked) {
                throw(std::bad_alloc());
            }
            auto* ndata = new std::byte[size + 8];
            std::memcpy(ndata, heap, bufferSize);
            if (usingAllocatedBuffer && !nonOwning) {
                delete[] heap;
            }
            heap = ndata;
            nonOwning = false;
            usingAllocatedBuffer = true;
            bufferCapacity = size + 8;
        }
    }